

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidReductionTypeWrongAxis(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  Arena *pAVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  Tensor *this_01;
  string *psVar7;
  long lVar8;
  ostream *poVar9;
  undefined1 local_d0 [8];
  Result res;
  ReduceMeanLayerParams *params;
  NeuralNetworkLayer *layers;
  NeuralNetwork *nn;
  ArrayFeatureType *outShape;
  FeatureDescription *out;
  ArrayFeatureType *inShape;
  FeatureDescription *in;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&in);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"input",pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"output",pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,2);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&in);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this,EXACT_ARRAY_MAPPING);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  this_01 = CoreML::Specification::NeuralNetworkLayer::add_inputtensor(this_00);
  CoreML::Specification::Tensor::set_rank(this_01,3);
  res.m_message.field_2._8_8_ =
       CoreML::Specification::NeuralNetworkLayer::mutable_reducemean(this_00);
  CoreML::Specification::ReduceMeanLayerParams::set_reduceall
            ((ReduceMeanLayerParams *)res.m_message.field_2._8_8_,false);
  CoreML::Specification::ReduceMeanLayerParams::add_axes
            ((ReduceMeanLayerParams *)res.m_message.field_2._8_8_,-5);
  CoreML::validate<(MLModelType)500>((Result *)local_d0,(Model *)&in);
  bVar1 = CoreML::Result::good((Result *)local_d0);
  if (bVar1) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1696);
    poVar9 = std::operator<<(poVar9,": error: ");
    poVar9 = std::operator<<(poVar9,"!((res).good())");
    poVar9 = std::operator<<(poVar9," was false, expected true.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    psVar7 = CoreML::Result::message_abi_cxx11_((Result *)local_d0);
    lVar8 = std::__cxx11::string::find((char *)psVar7,0x553c7c);
    if (lVar8 == -1) {
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar9 = std::operator<<(poVar9,":");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1697);
      poVar9 = std::operator<<(poVar9,": error: ");
      poVar9 = std::operator<<(poVar9,"res.message().find(\"axis\") != std::string::npos");
      poVar9 = std::operator<<(poVar9," was false, expected true.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      m._oneof_case_[0] = 0;
    }
  }
  CoreML::Result::~Result((Result *)local_d0);
  CoreML::Specification::Model::~Model((Model *)&in);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidReductionTypeWrongAxis() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);

    auto* params = layers->mutable_reducemean();
    params->set_reduceall(false);
    params->add_axes(-5);

    // axis should be in range [-rank, rank)
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    return 0;

}